

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O2

void tif_32sto5u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  byte *pbVar1;
  OPJ_INT32 OVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  OPJ_INT32 OVar6;
  ulong uVar7;
  sbyte sVar8;
  uint uVar9;
  byte *pbVar10;
  uint uVar11;
  
  pbVar10 = pDst + 4;
  for (uVar7 = 0; uVar7 < (length & 0xfffffffffffffff8); uVar7 = uVar7 + 8) {
    uVar11 = pSrc[uVar7 + 1];
    OVar2 = pSrc[uVar7 + 2];
    uVar9 = pSrc[uVar7 + 3];
    uVar3 = pSrc[uVar7 + 4];
    iVar4 = pSrc[uVar7 + 5];
    uVar5 = pSrc[uVar7 + 6];
    OVar6 = pSrc[uVar7 + 7];
    pbVar10[-4] = (byte)(uVar11 >> 2) | (byte)(pSrc[uVar7] << 3);
    pbVar10[-3] = (byte)(uVar9 >> 4) | (char)OVar2 * '\x02' | (byte)(uVar11 << 6);
    pbVar10[-2] = (byte)(uVar3 >> 1) | (byte)(uVar9 << 4);
    pbVar10[-1] = (byte)(uVar5 >> 3) | (byte)(iVar4 << 2) | (byte)(uVar3 << 7);
    *pbVar10 = (byte)(uVar5 << 5) | (byte)OVar6;
    pbVar10 = pbVar10 + 5;
  }
  if ((length & 7) != 0) {
    uVar11 = pSrc[uVar7];
    uVar9 = (uint)(length & 7);
    if (uVar9 == 1) {
      pbVar10 = pbVar10 + -4;
      sVar8 = 3;
    }
    else {
      pbVar10[-4] = (byte)((uint)pSrc[uVar7 + 1] >> 2) | (byte)(uVar11 << 3);
      uVar11 = pSrc[uVar7 + 1] & 3;
      if (uVar9 < 3) {
        sVar8 = 6;
        pbVar10 = pbVar10 + -3;
      }
      else {
        uVar11 = uVar11 << 5 | pSrc[uVar7 + 2];
        if (uVar9 == 3) {
          sVar8 = 1;
          pbVar10 = pbVar10 + -3;
        }
        else {
          pbVar10[-3] = (byte)((uint)pSrc[uVar7 + 3] >> 4) | (char)uVar11 * '\x02';
          uVar11 = pSrc[uVar7 + 3] & 0xf;
          if (uVar9 < 5) {
            pbVar10 = pbVar10 + -2;
            sVar8 = 4;
          }
          else {
            pbVar1 = pbVar10 + -1;
            pbVar10[-2] = (byte)((uint)pSrc[uVar7 + 4] >> 1) | (byte)(uVar11 << 4);
            uVar11 = pSrc[uVar7 + 4] & 1;
            if (uVar9 == 5) {
              sVar8 = 7;
              pbVar10 = pbVar1;
            }
            else {
              uVar11 = uVar11 << 5 | pSrc[uVar7 + 5];
              if (uVar9 == 7) {
                *pbVar1 = (byte)((uint)pSrc[uVar7 + 6] >> 3) | (byte)(uVar11 << 2);
                uVar11 = pSrc[uVar7 + 6] & 7;
                sVar8 = 5;
              }
              else {
                sVar8 = 2;
                pbVar10 = pbVar1;
              }
            }
          }
        }
      }
    }
    *pbVar10 = (byte)(uVar11 << sVar8);
  }
  return;
}

Assistant:

static void tif_32sto5u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst,
                        OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;

    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i + 1];
        OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i + 2];
        OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i + 3];
        OPJ_UINT32 src4 = (OPJ_UINT32)pSrc[i + 4];
        OPJ_UINT32 src5 = (OPJ_UINT32)pSrc[i + 5];
        OPJ_UINT32 src6 = (OPJ_UINT32)pSrc[i + 6];
        OPJ_UINT32 src7 = (OPJ_UINT32)pSrc[i + 7];

        *pDst++ = (OPJ_BYTE)((src0 << 3) | (src1 >> 2));
        *pDst++ = (OPJ_BYTE)((src1 << 6) | (src2 << 1) | (src3 >> 4));
        *pDst++ = (OPJ_BYTE)((src3 << 4) | (src4 >> 1));
        *pDst++ = (OPJ_BYTE)((src4 << 7) | (src5 << 2) | (src6 >> 3));
        *pDst++ = (OPJ_BYTE)((src6 << 5) | (src7));

    }

    if (length & 7U) {
        unsigned int trailing = 0U;
        int remaining = 8U;
        length &= 7U;
        PUTBITS((OPJ_UINT32)pSrc[i + 0], 5)
        if (length > 1U) {
            PUTBITS((OPJ_UINT32)pSrc[i + 1], 5)
            if (length > 2U) {
                PUTBITS((OPJ_UINT32)pSrc[i + 2], 5)
                if (length > 3U) {
                    PUTBITS((OPJ_UINT32)pSrc[i + 3], 5)
                    if (length > 4U) {
                        PUTBITS((OPJ_UINT32)pSrc[i + 4], 5)
                        if (length > 5U) {
                            PUTBITS((OPJ_UINT32)pSrc[i + 5], 5)
                            if (length > 6U) {
                                PUTBITS((OPJ_UINT32)pSrc[i + 6], 5)
                            }
                        }
                    }
                }
            }
        }
        FLUSHBITS()
    }
}